

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O1

int tdefl_flush_block(tdefl_compressor *d,int flush)

{
  mz_uint8 *pmVar1;
  tdefl_put_buf_func_ptr p_Var2;
  bool bVar3;
  uint uVar4;
  mz_bool mVar5;
  ulong uVar6;
  uint uVar7;
  mz_uint8 *pmVar8;
  int iVar9;
  mz_uint mVar10;
  ulong uVar11;
  bool bVar12;
  
  if ((d->m_flags & 0x80000) == 0) {
    bVar3 = false;
  }
  else {
    bVar3 = d->m_lookahead_pos - d->m_lz_code_buf_dict_pos <= d->m_dict_size;
  }
  if ((d->m_pPut_buf_func == (tdefl_put_buf_func_ptr)0x0) &&
     (0x14ccb < *d->m_pOut_buf_size - d->m_out_buf_ofs)) {
    pmVar8 = (mz_uint8 *)(d->m_out_buf_ofs + (long)d->m_pOut_buf);
  }
  else {
    pmVar8 = d->m_output_buf;
  }
  d->m_pOutput_buf = pmVar8;
  d->m_pOutput_buf_end = pmVar8 + 0x14cbc;
  d->m_output_flush_ofs = 0;
  d->m_output_flush_remaining = 0;
  *d->m_pLZ_flags = *d->m_pLZ_flags >> ((byte)d->m_num_flags_left & 0x1f);
  d->m_pLZ_code_buf = d->m_pLZ_code_buf + -(ulong)(d->m_num_flags_left == 8);
  if (((d->m_flags & 0x1000) != 0) && (d->m_block_index == 0)) {
    uVar4 = d->m_bits_in;
    d->m_bit_buffer = d->m_bit_buffer | 0x78 << ((byte)uVar4 & 0x1f);
    uVar7 = uVar4 + 8;
    d->m_bits_in = uVar7;
    if (uVar4 < 0xfffffff8) {
      do {
        pmVar1 = d->m_pOutput_buf;
        if (pmVar1 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar1 + 1;
          *pmVar1 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        uVar7 = d->m_bits_in - 8;
        d->m_bits_in = uVar7;
      } while (7 < uVar7);
    }
    d->m_bit_buffer = d->m_bit_buffer | 1 << ((byte)uVar7 & 0x1f);
    d->m_bits_in = uVar7 | 8;
    do {
      pmVar1 = d->m_pOutput_buf;
      if (pmVar1 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar1 + 1;
        *pmVar1 = (mz_uint8)d->m_bit_buffer;
      }
      d->m_bit_buffer = d->m_bit_buffer >> 8;
      uVar4 = d->m_bits_in - 8;
      d->m_bits_in = uVar4;
    } while (7 < uVar4);
  }
  d->m_bit_buffer = d->m_bit_buffer | (uint)(flush == 4) << ((byte)d->m_bits_in & 0x1f);
  uVar4 = d->m_bits_in + 1;
  d->m_bits_in = uVar4;
  while (7 < uVar4) {
    pmVar1 = d->m_pOutput_buf;
    if (pmVar1 < d->m_pOutput_buf_end) {
      d->m_pOutput_buf = pmVar1 + 1;
      *pmVar1 = (mz_uint8)d->m_bit_buffer;
    }
    d->m_bit_buffer = d->m_bit_buffer >> 8;
    uVar4 = d->m_bits_in - 8;
    d->m_bits_in = uVar4;
  }
  pmVar1 = d->m_pOutput_buf;
  mVar10 = d->m_bit_buffer;
  bVar12 = true;
  if (!bVar3) {
    uVar7 = 1;
    if ((d->m_flags & 0x40000) == 0) {
      uVar7 = (uint)(d->m_total_lz_bytes < 0x30);
    }
    mVar5 = tdefl_compress_block(d,uVar7);
    bVar12 = mVar5 == 0;
  }
  if (((!bVar3) &&
      (((ulong)d->m_total_lz_bytes == 0 ||
       ((long)(d->m_pOutput_buf + (1 - (long)pmVar1)) < (long)(ulong)d->m_total_lz_bytes)))) ||
     (d->m_dict_size < d->m_lookahead_pos - d->m_lz_code_buf_dict_pos)) {
    if (bVar12) {
      d->m_pOutput_buf = pmVar1;
      d->m_bit_buffer = mVar10;
      d->m_bits_in = uVar4;
      tdefl_compress_block(d,1);
    }
    goto LAB_001315f3;
  }
  d->m_pOutput_buf = pmVar1;
  d->m_bit_buffer = mVar10;
  d->m_bits_in = uVar4 + 2;
  if (uVar4 < 6) {
LAB_00131518:
    d->m_bits_in = 8;
    do {
      pmVar1 = d->m_pOutput_buf;
      if (pmVar1 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar1 + 1;
        *pmVar1 = (mz_uint8)d->m_bit_buffer;
      }
      d->m_bit_buffer = d->m_bit_buffer >> 8;
      uVar4 = d->m_bits_in - 8;
      d->m_bits_in = uVar4;
    } while (7 < uVar4);
  }
  else {
    do {
      pmVar1 = d->m_pOutput_buf;
      if (pmVar1 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar1 + 1;
        *pmVar1 = (mz_uint8)d->m_bit_buffer;
      }
      d->m_bit_buffer = d->m_bit_buffer >> 8;
      uVar4 = d->m_bits_in - 8;
      d->m_bits_in = uVar4;
    } while (7 < uVar4);
    if (uVar4 != 0) goto LAB_00131518;
  }
  iVar9 = 2;
  do {
    d->m_bit_buffer =
         d->m_bit_buffer | (uint)(ushort)d->m_total_lz_bytes << ((byte)d->m_bits_in & 0x1f);
    uVar4 = d->m_bits_in + 0x10;
    d->m_bits_in = uVar4;
    while (7 < uVar4) {
      pmVar1 = d->m_pOutput_buf;
      if (pmVar1 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar1 + 1;
        *pmVar1 = (mz_uint8)d->m_bit_buffer;
      }
      d->m_bit_buffer = d->m_bit_buffer >> 8;
      uVar4 = d->m_bits_in - 8;
      d->m_bits_in = uVar4;
    }
    d->m_total_lz_bytes = d->m_total_lz_bytes ^ 0xffff;
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  if (d->m_total_lz_bytes != 0) {
    uVar4 = 0;
    do {
      uVar7 = d->m_bits_in;
      d->m_bit_buffer =
           d->m_bit_buffer |
           (uint)d->m_dict[d->m_lz_code_buf_dict_pos + uVar4 & 0x7fff] << ((byte)uVar7 & 0x1f);
      d->m_bits_in = uVar7 + 8;
      if (uVar7 < 0xfffffff8) {
        do {
          pmVar1 = d->m_pOutput_buf;
          if (pmVar1 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar1 + 1;
            *pmVar1 = (mz_uint8)d->m_bit_buffer;
          }
          d->m_bit_buffer = d->m_bit_buffer >> 8;
          uVar7 = d->m_bits_in - 8;
          d->m_bits_in = uVar7;
        } while (7 < uVar7);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < d->m_total_lz_bytes);
  }
LAB_001315f3:
  if (flush != 0) {
    if (flush == 4) {
      if (d->m_bits_in != 0) {
        d->m_bits_in = 8;
        do {
          pmVar1 = d->m_pOutput_buf;
          if (pmVar1 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar1 + 1;
            *pmVar1 = (mz_uint8)d->m_bit_buffer;
          }
          d->m_bit_buffer = d->m_bit_buffer >> 8;
          uVar4 = d->m_bits_in - 8;
          d->m_bits_in = uVar4;
        } while (7 < uVar4);
      }
      if ((d->m_flags & 0x1000) != 0) {
        uVar4 = d->m_adler32;
        iVar9 = 0;
        do {
          uVar7 = d->m_bits_in;
          d->m_bit_buffer = d->m_bit_buffer | (uVar4 >> 0x18) << ((byte)uVar7 & 0x1f);
          d->m_bits_in = uVar7 + 8;
          if (uVar7 < 0xfffffff8) {
            do {
              pmVar1 = d->m_pOutput_buf;
              if (pmVar1 < d->m_pOutput_buf_end) {
                d->m_pOutput_buf = pmVar1 + 1;
                *pmVar1 = (mz_uint8)d->m_bit_buffer;
              }
              d->m_bit_buffer = d->m_bit_buffer >> 8;
              uVar7 = d->m_bits_in - 8;
              d->m_bits_in = uVar7;
            } while (7 < uVar7);
          }
          uVar4 = uVar4 << 8;
          iVar9 = iVar9 + 1;
        } while (iVar9 != 4);
      }
    }
    else {
      uVar4 = d->m_bits_in + 3;
      d->m_bits_in = uVar4;
      while (7 < uVar4) {
        pmVar1 = d->m_pOutput_buf;
        if (pmVar1 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar1 + 1;
          *pmVar1 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        uVar4 = d->m_bits_in - 8;
        d->m_bits_in = uVar4;
      }
      if (uVar4 != 0) {
        d->m_bits_in = 8;
        do {
          pmVar1 = d->m_pOutput_buf;
          if (pmVar1 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar1 + 1;
            *pmVar1 = (mz_uint8)d->m_bit_buffer;
          }
          d->m_bit_buffer = d->m_bit_buffer >> 8;
          uVar4 = d->m_bits_in - 8;
          d->m_bits_in = uVar4;
        } while (7 < uVar4);
      }
      uVar4 = 0;
      iVar9 = 2;
      do {
        d->m_bit_buffer = d->m_bit_buffer | uVar4 << ((byte)d->m_bits_in & 0x1f);
        uVar7 = d->m_bits_in + 0x10;
        d->m_bits_in = uVar7;
        while (7 < uVar7) {
          pmVar1 = d->m_pOutput_buf;
          if (pmVar1 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar1 + 1;
            *pmVar1 = (mz_uint8)d->m_bit_buffer;
          }
          d->m_bit_buffer = d->m_bit_buffer >> 8;
          uVar7 = d->m_bits_in - 8;
          d->m_bits_in = uVar7;
        }
        uVar4 = uVar4 ^ 0xffff;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
  }
  memset(d->m_huff_count,0,0x280);
  d->m_pLZ_code_buf = d->m_lz_code_buf + 1;
  d->m_pLZ_flags = d->m_lz_code_buf;
  mVar10 = d->m_total_lz_bytes;
  d->m_num_flags_left = 8;
  d->m_total_lz_bytes = 0;
  d->m_lz_code_buf_dict_pos = d->m_lz_code_buf_dict_pos + mVar10;
  d->m_block_index = d->m_block_index + 1;
  iVar9 = (int)d->m_pOutput_buf - (int)pmVar8;
  if (iVar9 != 0) {
    p_Var2 = d->m_pPut_buf_func;
    if (p_Var2 == (tdefl_put_buf_func_ptr)0x0) {
      uVar6 = (ulong)iVar9;
      if (pmVar8 == d->m_output_buf) {
        uVar11 = *d->m_pOut_buf_size - d->m_out_buf_ofs;
        if (uVar6 < uVar11) {
          uVar11 = uVar6;
        }
        mVar10 = (mz_uint)uVar11;
        __wrap_memcpy((void *)(d->m_out_buf_ofs + (long)d->m_pOut_buf),d->m_output_buf,
                      (long)(int)mVar10);
        d->m_out_buf_ofs = d->m_out_buf_ofs + (long)(int)mVar10;
        if (iVar9 - mVar10 != 0) {
          d->m_output_flush_ofs = mVar10;
          d->m_output_flush_remaining = iVar9 - mVar10;
        }
      }
      else {
        d->m_out_buf_ofs = d->m_out_buf_ofs + uVar6;
      }
    }
    else {
      *d->m_pIn_buf_size = (long)d->m_pSrc - (long)d->m_pIn_buf;
      mVar5 = (*p_Var2)(d->m_output_buf,iVar9,d->m_pPut_buf_user);
      if (mVar5 == 0) {
        d->m_prev_return_status = TDEFL_STATUS_PUT_BUF_FAILED;
        return -1;
      }
    }
  }
  return d->m_output_flush_remaining;
}

Assistant:

static int tdefl_flush_block(tdefl_compressor *d, int flush)
{
  mz_uint saved_bit_buf, saved_bits_in;
  mz_uint8 *pSaved_output_buf;
  mz_bool comp_block_succeeded = MZ_FALSE;
  int n, use_raw_block = ((d->m_flags & TDEFL_FORCE_ALL_RAW_BLOCKS) != 0) && (d->m_lookahead_pos - d->m_lz_code_buf_dict_pos) <= d->m_dict_size;
  mz_uint8 *pOutput_buf_start = ((d->m_pPut_buf_func == NULL) && ((*d->m_pOut_buf_size - d->m_out_buf_ofs) >= TDEFL_OUT_BUF_SIZE)) ? ((mz_uint8 *)d->m_pOut_buf + d->m_out_buf_ofs) : d->m_output_buf;

  d->m_pOutput_buf = pOutput_buf_start;
  d->m_pOutput_buf_end = d->m_pOutput_buf + TDEFL_OUT_BUF_SIZE - 16;

  MZ_ASSERT(!d->m_output_flush_remaining);
  d->m_output_flush_ofs = 0;
  d->m_output_flush_remaining = 0;

  *d->m_pLZ_flags = (mz_uint8)(*d->m_pLZ_flags >> d->m_num_flags_left);
  d->m_pLZ_code_buf -= (d->m_num_flags_left == 8);

  if ((d->m_flags & TDEFL_WRITE_ZLIB_HEADER) && (!d->m_block_index))
  {
    TDEFL_PUT_BITS(0x78, 8); TDEFL_PUT_BITS(0x01, 8);
  }

  TDEFL_PUT_BITS(flush == TDEFL_FINISH, 1);

  pSaved_output_buf = d->m_pOutput_buf; saved_bit_buf = d->m_bit_buffer; saved_bits_in = d->m_bits_in;

  if (!use_raw_block)
    comp_block_succeeded = tdefl_compress_block(d, (d->m_flags & TDEFL_FORCE_ALL_STATIC_BLOCKS) || (d->m_total_lz_bytes < 48));

  // If the block gets expanded, forget the current contents of the output buffer and send a raw block instead.
  if ( ((use_raw_block) || ((d->m_total_lz_bytes) && ((d->m_pOutput_buf - pSaved_output_buf + 1U) >= d->m_total_lz_bytes))) &&
       ((d->m_lookahead_pos - d->m_lz_code_buf_dict_pos) <= d->m_dict_size) )
  {
    mz_uint i; d->m_pOutput_buf = pSaved_output_buf; d->m_bit_buffer = saved_bit_buf, d->m_bits_in = saved_bits_in;
    TDEFL_PUT_BITS(0, 2);
    if (d->m_bits_in) { TDEFL_PUT_BITS(0, 8 - d->m_bits_in); }
    for (i = 2; i; --i, d->m_total_lz_bytes ^= 0xFFFF)
    {
      TDEFL_PUT_BITS(d->m_total_lz_bytes & 0xFFFF, 16);
    }
    for (i = 0; i < d->m_total_lz_bytes; ++i)
    {
      TDEFL_PUT_BITS(d->m_dict[(d->m_lz_code_buf_dict_pos + i) & TDEFL_LZ_DICT_SIZE_MASK], 8);
    }
  }
  // Check for the extremely unlikely (if not impossible) case of the compressed block not fitting into the output buffer when using dynamic codes.
  else if (!comp_block_succeeded)
  {
    d->m_pOutput_buf = pSaved_output_buf; d->m_bit_buffer = saved_bit_buf, d->m_bits_in = saved_bits_in;
    tdefl_compress_block(d, MZ_TRUE);
  }

  if (flush)
  {
    if (flush == TDEFL_FINISH)
    {
      if (d->m_bits_in) { TDEFL_PUT_BITS(0, 8 - d->m_bits_in); }
      if (d->m_flags & TDEFL_WRITE_ZLIB_HEADER) { mz_uint i, a = d->m_adler32; for (i = 0; i < 4; i++) { TDEFL_PUT_BITS((a >> 24) & 0xFF, 8); a <<= 8; } }
    }
    else
    {
      mz_uint i, z = 0; TDEFL_PUT_BITS(0, 3); if (d->m_bits_in) { TDEFL_PUT_BITS(0, 8 - d->m_bits_in); } for (i = 2; i; --i, z ^= 0xFFFF) { TDEFL_PUT_BITS(z & 0xFFFF, 16); }
    }
  }

  MZ_ASSERT(d->m_pOutput_buf < d->m_pOutput_buf_end);

  memset(&d->m_huff_count[0][0], 0, sizeof(d->m_huff_count[0][0]) * TDEFL_MAX_HUFF_SYMBOLS_0);
  memset(&d->m_huff_count[1][0], 0, sizeof(d->m_huff_count[1][0]) * TDEFL_MAX_HUFF_SYMBOLS_1);

  d->m_pLZ_code_buf = d->m_lz_code_buf + 1; d->m_pLZ_flags = d->m_lz_code_buf; d->m_num_flags_left = 8; d->m_lz_code_buf_dict_pos += d->m_total_lz_bytes; d->m_total_lz_bytes = 0; d->m_block_index++;

  if ((n = (int)(d->m_pOutput_buf - pOutput_buf_start)) != 0)
  {
    if (d->m_pPut_buf_func)
    {
      *d->m_pIn_buf_size = d->m_pSrc - (const mz_uint8 *)d->m_pIn_buf;
      if (!(*d->m_pPut_buf_func)(d->m_output_buf, n, d->m_pPut_buf_user))
        return (d->m_prev_return_status = TDEFL_STATUS_PUT_BUF_FAILED);
    }
    else if (pOutput_buf_start == d->m_output_buf)
    {
      int bytes_to_copy = (int)MZ_MIN((size_t)n, (size_t)(*d->m_pOut_buf_size - d->m_out_buf_ofs));
      memcpy((mz_uint8 *)d->m_pOut_buf + d->m_out_buf_ofs, d->m_output_buf, bytes_to_copy);
      d->m_out_buf_ofs += bytes_to_copy;
      if ((n -= bytes_to_copy) != 0)
      {
        d->m_output_flush_ofs = bytes_to_copy;
        d->m_output_flush_remaining = n;
      }
    }
    else
    {
      d->m_out_buf_ofs += n;
    }
  }

  return d->m_output_flush_remaining;
}